

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<int,_false,_6>_> immutable::rrb_create<int,false,6>(void)

{
  leaf_node<int,_false> *p;
  rrb<int,_false,_6> *in_RDI;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_20;
  rrb<int,_false,_6> *local_18;
  rrb<int,_false,_6> *empty;
  
  local_18 = (rrb<int,_false,_6> *)malloc(0x28);
  local_18->cnt = 0;
  local_18->shift = 0;
  (local_18->root).ptr = (tree_node<int,_false> *)0x0;
  (local_18->tail).ptr = (leaf_node<int,_false> *)0x0;
  local_18->tail_len = 0;
  p = rrb_details::create_empty_leaf<int,false>();
  ref<immutable::rrb_details::leaf_node<int,_false>_>::ref(&local_20,p);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&local_18->tail,&local_20);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref(&local_20);
  ref<immutable::rrb<int,_false,_6>_>::ref((ref<immutable::rrb<int,_false,_6>_> *)in_RDI,local_18);
  return (ref<immutable::rrb<int,_false,_6>_>)in_RDI;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_create()
    {
    rrb<T, atomic_ref_counting, N>* empty = (rrb<T, atomic_ref_counting, N>*)malloc(sizeof(rrb<T, atomic_ref_counting, N>));
    empty->cnt = 0;
    empty->shift = 0;
    empty->root.ptr = nullptr;
    empty->tail.ptr = nullptr;
    empty->tail_len = 0;
    empty->tail = rrb_details::create_empty_leaf<T, atomic_ref_counting>();
    return ref<rrb<T, atomic_ref_counting, N>>(empty);
    }